

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O3

void __thiscall QWidgetRepaintManager::addStaticWidget(QWidgetRepaintManager *this,QWidget *widget)

{
  long lVar1;
  long *plVar2;
  long i;
  long lVar3;
  long in_FS_OFFSET;
  QWidget *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget != (QWidget *)0x0) {
    i = *(long *)(this + 0x78);
    if (i != 0) {
      lVar3 = 0;
      do {
        if (i * 8 - lVar3 == 0) goto LAB_0031892b;
        lVar1 = lVar3 + 8;
        plVar2 = (long *)(*(long *)(this + 0x70) + lVar3);
        lVar3 = lVar1;
      } while ((QWidget *)*plVar2 != widget);
      if (lVar1 != 0) goto LAB_00318948;
    }
LAB_0031892b:
    local_18 = widget;
    QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
              ((QPodArrayOps<QWidget*> *)(this + 0x68),i,&local_18);
    QList<QWidget_*>::end((QList<QWidget_*> *)(this + 0x68));
  }
LAB_00318948:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetRepaintManager::addStaticWidget(QWidget *widget)
{
    if (!widget)
        return;

    Q_ASSERT(widget->testAttribute(Qt::WA_StaticContents));
    if (!staticWidgets.contains(widget))
        staticWidgets.append(widget);
}